

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

void spirv_cross::inner::
     join_helper<char_const*,std::__cxx11::string&,std::__cxx11::string,char_const(&)[3]>
               (StringStream<4096UL,_4096UL> *stream,char **t,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,
               char (*ts_2) [3])

{
  char *__s;
  size_t len;
  
  __s = *t;
  len = strlen(__s);
  StringStream<4096UL,_4096UL>::append(stream,__s,len);
  StringStream<4096UL,_4096UL>::append(stream,(ts->_M_dataplus)._M_p,ts->_M_string_length);
  join_helper<std::__cxx11::string,char_const(&)[3]>(stream,ts_1,ts_2);
  return;
}

Assistant:

void join_helper(StringStream<> &stream, T &&t, Ts &&... ts)
{
	stream << std::forward<T>(t);
	join_helper(stream, std::forward<Ts>(ts)...);
}